

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O1

void __thiscall CTcGenTarg::build_intrinsic_class_objs(CTcGenTarg *this,CTcDataStream *str)

{
  CTcSymObj *pCVar1;
  uint32_t tmp;
  size_t in_RCX;
  tc_meta_entry *ptVar2;
  uint16_t tmp_1;
  short sVar3;
  undefined2 local_3e;
  undefined2 local_3c;
  short local_3a;
  tctarg_obj_id_t local_38;
  undefined4 local_34;
  
  ptVar2 = this->meta_head_;
  if (ptVar2 != (tc_meta_entry *)0x0) {
    sVar3 = 0;
    do {
      if (ptVar2->sym != (CTcSymMetaclass *)0x0) {
        local_38 = (ptVar2->sym->super_CTcSymMetaclassBase).class_obj_;
        CTcDataStream::write(str,(int)&local_38,(void *)0x4,in_RCX);
        local_3e = 8;
        CTcDataStream::write(str,(int)&local_3e,(void *)0x2,in_RCX);
        local_3c = 8;
        CTcDataStream::write(str,(int)&local_3c,(void *)0x2,in_RCX);
        local_3a = sVar3;
        CTcDataStream::write(str,(int)&local_3a,(void *)0x2,in_RCX);
        pCVar1 = (ptVar2->sym->super_CTcSymMetaclassBase).mod_obj_;
        if (pCVar1 == (CTcSymObj *)0x0) {
          local_34 = 0;
        }
        else {
          local_34 = (undefined4)(pCVar1->super_CTcSymObjBase).obj_id_;
        }
        CTcDataStream::write(str,(int)&local_34,(void *)0x4,in_RCX);
        CTcSymMetaclass::fix_mod_obj_sc_list(ptVar2->sym);
      }
      ptVar2 = ptVar2->nxt;
      sVar3 = sVar3 + 1;
    } while (ptVar2 != (tc_meta_entry *)0x0);
  }
  return;
}

Assistant:

void CTcGenTarg::build_intrinsic_class_objs(CTcDataStream *str)
{
    tc_meta_entry *meta;
    uint idx;
    
    /* 
     *   run through the dependency table, and create an IntrinsicClass
     *   object for each entry 
     */
    for (idx = 0, meta = meta_head_ ; meta != 0 ; meta = meta->nxt, ++idx)
    {
        /* 
         *   if we have a symbol for this class, add the object to the
         *   intrinsic class stream 
         */
        if (meta->sym != 0)
        {
            /* write the OBJS header */
            str->write4(meta->sym->get_class_obj());
            str->write2(8);

            /* 
             *   write the data - the data length (8), followed by the
             *   intrinsic class index that this object is associated
             *   with, followed by the modifier object
             */
            str->write2(8);
            str->write2(idx);
            str->write4(meta->sym->get_mod_obj() == 0
                        ? VM_INVALID_OBJ
                        : meta->sym->get_mod_obj()->get_obj_id());

            /* 
             *   fix up the inheritance chain in the modifier objects, if
             *   necessary 
             */
            meta->sym->fix_mod_obj_sc_list();
        }
    }
}